

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

void custom_flags_example(void)

{
  pattern_formatter *this;
  allocator local_31;
  unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_> formatter;
  string local_28;
  
  spdlog::details::make_unique<spdlog::pattern_formatter>();
  this = spdlog::pattern_formatter::add_flag<my_formatter_flag>
                   ((pattern_formatter *)
                    formatter._M_t.
                    super___uniq_ptr_impl<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>
                    .super__Head_base<0UL,_spdlog::pattern_formatter_*,_false>._M_head_impl,'*');
  std::__cxx11::string::string((string *)&local_28,"[%n] [%*] [%^%l%$] %v",&local_31);
  spdlog::pattern_formatter::set_pattern(this,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>::
  ~unique_ptr(&formatter);
  return;
}

Assistant:

void custom_flags_example() {
    using spdlog::details::make_unique;  // for pre c++14
    auto formatter = make_unique<spdlog::pattern_formatter>();
    formatter->add_flag<my_formatter_flag>('*').set_pattern("[%n] [%*] [%^%l%$] %v");
    // set the new formatter using spdlog::set_formatter(formatter) or
    // logger->set_formatter(formatter) spdlog::set_formatter(std::move(formatter));
}